

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapElements
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index1,
          int index2)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  void **ppvVar5;
  void *pvVar6;
  uint *puVar7;
  bool *pbVar8;
  double *pdVar9;
  float *pfVar10;
  ExtensionSet *this_00;
  RepeatedField<unsigned_int> *pRVar11;
  RepeatedPtrFieldBase *pRVar12;
  RepeatedField<bool> *pRVar13;
  RepeatedField<double> *pRVar14;
  RepeatedField<float> *pRVar15;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    this_00 = MutableExtensionSet(this,message);
    ExtensionSet::SwapElements(this_00,*(int *)(field + 0x28),index1,index2);
    return;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4)) {
  case 1:
  case 8:
    pRVar11 = (RepeatedField<unsigned_int> *)
              MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
    goto LAB_0020eb41;
  case 2:
    pRVar12 = (RepeatedPtrFieldBase *)
              MutableRaw<google::protobuf::RepeatedField<long>>(this,message,field);
    goto LAB_0020eb15;
  case 3:
    pRVar11 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
LAB_0020eb41:
    puVar7 = pRVar11->elements_;
    uVar4 = puVar7[index1];
    puVar7[index1] = puVar7[index2];
    puVar7[index2] = uVar4;
    break;
  case 4:
    pRVar12 = (RepeatedPtrFieldBase *)
              MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
    goto LAB_0020eb15;
  case 5:
    pRVar14 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message,field);
    pdVar9 = pRVar14->elements_;
    dVar2 = pdVar9[index1];
    pdVar9[index1] = pdVar9[index2];
    pdVar9[index2] = dVar2;
    break;
  case 6:
    pRVar15 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message,field);
    pfVar10 = pRVar15->elements_;
    fVar1 = pfVar10[index1];
    pfVar10[index1] = pfVar10[index2];
    pfVar10[index2] = fVar1;
    break;
  case 7:
    pRVar13 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
    pbVar8 = pRVar13->elements_;
    bVar3 = pbVar8[index1];
    pbVar8[index1] = pbVar8[index2];
    pbVar8[index2] = bVar3;
    break;
  case 9:
  case 10:
    pRVar12 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
LAB_0020eb15:
    ppvVar5 = pRVar12->elements_;
    pvVar6 = ppvVar5[index1];
    ppvVar5[index1] = ppvVar5[index2];
    ppvVar5[index2] = pvVar6;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SwapElements(
    Message* message,
    const FieldDescriptor* field,
    int index1,
    int index2) const {
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)                 \
            ->SwapElements(index1, index2);                                   \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->SwapElements(index1, index2);
        break;
    }
  }
}